

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O0

void nghttp2_pq_update(nghttp2_pq *pq,nghttp2_pq_item_cb fun,void *arg)

{
  uint uVar1;
  uint local_2c;
  size_t sStack_28;
  int rv;
  size_t i;
  void *arg_local;
  nghttp2_pq_item_cb fun_local;
  nghttp2_pq *pq_local;
  
  local_2c = 0;
  if (pq->length != 0) {
    for (sStack_28 = 0; sStack_28 < pq->length; sStack_28 = sStack_28 + 1) {
      uVar1 = (*fun)(pq->q[sStack_28],arg);
      local_2c = uVar1 | local_2c;
    }
    if (local_2c != 0) {
      for (sStack_28 = pq->length; sStack_28 != 0; sStack_28 = sStack_28 - 1) {
        bubble_down(pq,sStack_28 - 1);
      }
    }
  }
  return;
}

Assistant:

void nghttp2_pq_update(nghttp2_pq *pq, nghttp2_pq_item_cb fun, void *arg) {
  size_t i;
  int rv = 0;
  if (pq->length == 0) {
    return;
  }
  for (i = 0; i < pq->length; ++i) {
    rv |= (*fun)(pq->q[i], arg);
  }
  if (rv) {
    for (i = pq->length; i > 0; --i) {
      bubble_down(pq, i - 1);
    }
  }
}